

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Server::Server(Server *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_21;
  
  this->_vptr_Server = (_func_int **)&PTR__Server_001bf308;
  *(undefined8 *)&(this->new_task_queue).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->new_task_queue).super__Function_base._M_functor + 8) = 0;
  (this->new_task_queue)._M_invoker =
       std::
       _Function_handler<httplib::TaskQueue_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:5507:11)>
       ::_M_invoke;
  (this->new_task_queue).super__Function_base._M_manager =
       std::
       _Function_handler<httplib::TaskQueue_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:5507:11)>
       ::_M_manager;
  (this->svr_sock_).super___atomic_base<int>._M_i = -1;
  this->keep_alive_max_count_ = 5;
  this->keep_alive_timeout_sec_ = 5;
  this->read_timeout_sec_ = 5;
  this->read_timeout_usec_ = 0;
  this->write_timeout_sec_ = 5;
  this->idle_interval_usec_ = 0;
  this->write_timeout_usec_ = 0;
  this->idle_interval_sec_ = 0;
  this->payload_max_length_ = 0xffffffffffffffff;
  this->is_running_ = (__atomic_base<bool>)0x0;
  this->done_ = (__atomic_base<bool>)0x0;
  (this->base_dirs_).
  super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->base_dirs_).
  super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->base_dirs_).
  super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->file_extension_and_mimetype_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->file_extension_and_mimetype_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->file_extension_and_mimetype_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->file_extension_and_mimetype_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->file_extension_and_mimetype_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->file_extension_and_mimetype_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->default_file_mimetype_,"application/octet-stream",&local_21);
  *(undefined8 *)((long)&(this->socket_options_).super__Function_base._M_functor + 8) = 0;
  memset(&this->file_request_handler_,0,0x1d5);
  *(code **)&(this->socket_options_).super__Function_base._M_functor = default_socket_options;
  (this->socket_options_)._M_invoker = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  (this->socket_options_).super__Function_base._M_manager =
       std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  p_Var1 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)((long)&(this->header_writer_).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->header_writer_).super__Function_base._M_functor = detail::write_headers;
  (this->header_writer_)._M_invoker =
       std::
       _Function_handler<long_(httplib::Stream_&,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_long_(*)(httplib::Stream_&,_const_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
       ::_M_invoke;
  (this->header_writer_).super__Function_base._M_manager =
       std::
       _Function_handler<long_(httplib::Stream_&,_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_long_(*)(httplib::Stream_&,_const_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
       ::_M_manager;
  signal(0xd,(__sighandler_t)0x1);
  return;
}

Assistant:

inline Server::Server()
    : new_task_queue(
          [] { return new ThreadPool(CPPHTTPLIB_THREAD_POOL_COUNT); }) {
#ifndef _WIN32
  signal(SIGPIPE, SIG_IGN);
#endif
}